

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_full_io.c
# Opt level: O3

int s3gau_read_maybe_full
              (char *fn,vector_t *****out,uint32 *out_n_mgau,uint32 *out_n_feat,
              uint32 *out_n_density,uint32 **out_veclen,uint32 need_full)

{
  uint uVar1;
  uint32 **ppuVar2;
  int iVar3;
  int32 iVar4;
  uint uVar5;
  FILE *fp;
  char *__s1;
  char *pcVar6;
  uint32 *buf;
  vector_t ****pppppfVar7;
  size_t d4;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined7 uVar14;
  uint32 n_feat;
  uint32 swap;
  uint32 chksum;
  uint32 n_density;
  uint32 n_mgau;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 n;
  float32 *raw;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar15;
  uint local_8c;
  uint32 local_88;
  uint32 local_84;
  uint local_80;
  uint local_7c;
  ulong local_78;
  undefined4 local_70;
  uint32 local_6c;
  uint32 local_68;
  uint local_64;
  uint32 **local_60;
  uint32 *local_58;
  uint32 *local_50;
  vector_t *****local_48;
  uint32 *local_40;
  void *local_38;
  
  uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_84 = 0;
  local_6c = 0;
  local_48 = out;
  local_40 = out_n_mgau;
  fp = s3open(fn,"rb",&local_88);
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_58 = out_n_feat;
  local_50 = out_n_density;
  __s1 = s3get_gvn_fattr("version");
  if (__s1 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,0x5e,"No version attribute for %s\n",fn);
  }
  else {
    iVar3 = strcmp(__s1,"1.0");
    if (iVar3 == 0) {
      pcVar6 = s3get_gvn_fattr("chksum0");
      uVar14 = (undefined7)((ulong)__s1 >> 8);
      if (pcVar6 == (char *)0x0) {
        uVar13 = (undefined4)CONCAT71(uVar14,1);
      }
      else if ((*pcVar6 == 'n') && (pcVar6[1] == 'o')) {
        uVar13 = (undefined4)CONCAT71(uVar14,pcVar6[2] == '\0');
      }
      else {
        uVar13 = 0;
      }
      iVar4 = bio_fread(&local_7c,4,1,fp,local_88,&local_84);
      if (((iVar4 == 1) && (iVar4 = bio_fread(&local_8c,4,1,fp,local_88,&local_84), iVar4 == 1)) &&
         (iVar4 = bio_fread(&local_80,4,1,fp,local_88,&local_84), iVar4 == 1)) {
        buf = (uint32 *)
              __ckd_calloc__((ulong)local_8c,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                             ,0x74);
        uVar5 = bio_fread(buf,4,local_8c,fp,local_88,&local_84);
        if (uVar5 == local_8c) {
          iVar4 = bio_fread_1d(&local_38,4,&local_64,fp,local_88,&local_84);
          if (iVar4 < 0) {
            ckd_free(buf);
          }
          else {
            uVar8 = (ulong)local_8c;
            d4 = 0;
            iVar3 = 0;
            if (uVar8 != 0) {
              uVar5 = 0;
              do {
                uVar1 = buf[d4];
                iVar3 = iVar3 + uVar1 * uVar1;
                if (uVar5 < uVar1) {
                  uVar5 = uVar1;
                }
                d4 = d4 + 1;
              } while (uVar8 != d4);
              d4 = (size_t)uVar5;
            }
            uVar5 = local_80 * local_7c * iVar3;
            if (local_64 == uVar5) {
              local_70 = uVar13;
              local_60 = out_veclen;
              pppppfVar7 = (vector_t ****)
                           __ckd_calloc_4d__((ulong)local_7c,uVar8,(ulong)local_80,d4,8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                             ,0x8b);
              ppuVar2 = local_60;
              local_78 = (ulong)local_7c;
              if (local_78 != 0) {
                uVar8 = 0;
                uVar9 = 0;
                do {
                  if ((ulong)local_8c != 0) {
                    uVar10 = 0;
                    do {
                      if ((ulong)local_80 != 0) {
                        uVar5 = buf[uVar10];
                        uVar11 = 0;
                        do {
                          if ((ulong)uVar5 != 0) {
                            uVar12 = 0;
                            do {
                              pppppfVar7[uVar8][uVar10][uVar11][uVar12] =
                                   (vector_t)(uVar9 * 4 + (long)local_38);
                              uVar12 = uVar12 + 1;
                              uVar9 = (ulong)((int)uVar9 + uVar5);
                            } while (uVar5 != uVar12);
                          }
                          uVar11 = uVar11 + 1;
                        } while (uVar11 != local_80);
                      }
                      uVar10 = uVar10 + 1;
                    } while (uVar10 != local_8c);
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 != local_78);
              }
              if ((char)local_70 == '\0') {
                iVar4 = bio_fread(&local_68,4,1,fp,local_88,&local_6c);
                if (iVar4 != 1) goto LAB_00103af8;
                if (local_68 != local_84) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                          ,0xa2,"Checksum error; read corrupt data.\n");
                  goto LAB_00103b5e;
                }
                local_78 = (ulong)local_7c;
              }
              *local_48 = pppppfVar7;
              *local_40 = (uint32)local_78;
              *local_58 = local_8c;
              *local_50 = local_80;
              *ppuVar2 = buf;
              s3close(fp);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                      ,0xb0,"Read %s [%ux%ux%u array of full matrices]\n",fn,(ulong)local_7c,
                      CONCAT44(uVar15,local_8c),local_80);
              return 0;
            }
            if (need_full != 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                      ,0x86,"Failed to read full covariance file %s (expected %d values, got %d)\n",
                      fn,(ulong)uVar5,CONCAT44(uVar15,local_64));
            }
          }
        }
      }
LAB_00103af8:
      s3close(fp);
      return -1;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,0x5a,"Version mismatch for %s, file ver: %s != reader ver: %s\n",fn,__s1,"1.0");
  }
LAB_00103b5e:
  exit(1);
}

Assistant:

int
s3gau_read_maybe_full(const char *fn,
		      vector_t *****out,
		      uint32 *out_n_mgau,
		      uint32 *out_n_feat,
	  	      uint32 *out_n_density,
		      uint32 **out_veclen,
		      uint32 need_full)
{
    FILE *fp;
    const char *do_chk;
    const char *ver;
    uint32 n_mgau, n_feat, n_density;
    uint32 *veclen, maxveclen;
    uint32 blk, i, j, k, l, r, n;
    uint32 chksum = 0;
    uint32 sv_chksum, ignore = 0;
    float32 *raw;
    vector_t ****o;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAU_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAU_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (do_chk && !strcmp(do_chk, "no")) {
        do_chk = NULL;
    }
    
    if (bio_fread(&n_mgau, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_feat, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_density, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    veclen = ckd_calloc(n_feat, sizeof(uint32));
    if (bio_fread(veclen, sizeof(uint32), n_feat, fp, swap, &chksum) != n_feat) {
	goto error;
    }

    if (bio_fread_1d((void **)&raw, sizeof(float32), &n, fp, swap, &chksum) < 0) {
	ckd_free(veclen);

	goto error;
    }

    for (i = 0, blk = 0, maxveclen = 0; i < n_feat; i++) {
	blk += veclen[i] * veclen[i];
	if (veclen[i] > maxveclen) maxveclen = veclen[i];
    }
    if (n != n_mgau * n_density * blk) {
	if (need_full)
	     E_ERROR("Failed to read full covariance file %s (expected %d values, got %d)\n",
	     	     fn, n_mgau * n_density * blk, n);
	goto error;
    }

    o = (vector_t ****)ckd_calloc_4d(n_mgau, n_feat, n_density,
				     maxveclen, sizeof(vector_t));

    for (i = 0, r = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    o[i][j][k][l] = &raw[r];

		    r += veclen[j];
		}
	    }
	}
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
            goto error;
	}

	if (sv_chksum != chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }


    *out = o;
    *out_n_mgau = n_mgau;
    *out_n_feat = n_feat;
    *out_n_density = n_density;
    *out_veclen = veclen;

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array of full matrices]\n",
	   fn, n_mgau, n_feat, n_density);

    return S3_SUCCESS;

error:
    if (fp) s3close(fp);

    return S3_ERROR;
}